

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-reference.c
# Opt level: O1

void KeccakP1600OnWords(tKeccakLane *state,uint nrRounds)

{
  uint indexRound;
  
  indexRound = 0x18 - nrRounds;
  if (indexRound < 0x18) {
    do {
      KeccakP1600Round(state,indexRound);
      indexRound = indexRound + 1;
    } while (indexRound != 0x18);
  }
  return;
}

Assistant:

void KeccakP1600OnWords(tKeccakLane *state, unsigned int nrRounds)
{
    unsigned int i;

#ifdef KeccakReference
    displayStateAsLanes(3, "Same, with lanes as 64-bit words", state, 1600);
#endif

    for(i=(maxNrRounds-nrRounds); i<maxNrRounds; i++)
        KeccakP1600Round(state, i);
}